

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O2

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,optional<tinyusdz::Payload> *value)

{
  bool bVar1;
  Payload v;
  Payload local_140;
  
  bVar1 = MaybeNone(this);
  if (bVar1) {
    nonstd::optional_lite::optional<tinyusdz::Payload>::reset(value);
    bVar1 = true;
  }
  else {
    Payload::Payload(&local_140);
    bVar1 = ReadBasicType(this,&local_140);
    if (bVar1) {
      nonstd::optional_lite::optional<tinyusdz::Payload>::operator=(value,&local_140);
    }
    Payload::~Payload(&local_140);
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<Payload> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  Payload v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}